

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

PAL_ERROR CorUnix::CreateInitialProcessAndThreadObjects(CPalThread *pThread)

{
  PAL_ERROR PVar1;
  char *__format;
  undefined8 uStack_60;
  CObjectAttributes oa;
  HANDLE hThread;
  IDataLock *pDataLock;
  CProcProcessLocalData *pLocalData;
  HANDLE hProcess;
  IPalObject *pobjProcess;
  
  hProcess = (HANDLE)0x0;
  uStack_60 = 0;
  oa.sObjectName.m_pwsz = (WCHAR *)0x0;
  oa.sObjectName.m_dwStringLength = 0;
  oa.sObjectName.m_dwMaxLength = 0;
  PVar1 = CreateThreadObject(pThread,pThread,&oa.pSecurityAttributes);
  if (PVar1 == 0) {
    (**(code **)(*g_pObjectManager + 0x20))(g_pObjectManager,pThread,oa.pSecurityAttributes);
    PVar1 = (**(code **)*g_pObjectManager)(g_pObjectManager,pThread,&otProcess,&uStack_60,&hProcess)
    ;
    if (PVar1 == 0) {
      PVar1 = (**(code **)(*hProcess + 0x18))(hProcess,pThread,1,&hThread,&pDataLock);
      if (PVar1 == 0) {
        *(DWORD *)&pDataLock->_vptr_IDataLock = gPID;
        *(undefined4 *)((long)&pDataLock->_vptr_IDataLock + 4) = 2;
        (*(code *)**hThread)(hThread,pThread,1);
        PVar1 = (**(code **)(*g_pObjectManager + 8))
                          (g_pObjectManager,pThread,hProcess,&aotProcess,0x1f0fff,&pLocalData,
                           &g_pobjProcess);
        hProcess = (HANDLE)0x0;
        if (PVar1 == 0) {
          (**(code **)(*g_pObjectManager + 0x20))(g_pObjectManager,pThread,pLocalData);
          PVar1 = 0;
          goto LAB_002082c1;
        }
        fprintf(_stderr,"] %s %s:%d","CreateInitialProcessAndThreadObjects",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                ,0x717);
        __format = "Failure registering process object";
      }
      else {
        fprintf(_stderr,"] %s %s:%d","CreateInitialProcessAndThreadObjects",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                ,0x6fd);
        __format = "Unable to access local data";
      }
      fprintf(_stderr,__format);
    }
    else if (PAL_InitializeChakraCoreCalled == false) {
      abort();
    }
  }
LAB_002082c1:
  if (hProcess != (HANDLE)0x0) {
    (**(code **)(*hProcess + 0x40))(hProcess,pThread);
  }
  return PVar1;
}

Assistant:

PAL_ERROR
CorUnix::CreateInitialProcessAndThreadObjects(
    CPalThread *pThread
    )
{
    PAL_ERROR palError = NO_ERROR;
    HANDLE hThread;
    IPalObject *pobjProcess = NULL;
    IDataLock *pDataLock;
    CProcProcessLocalData *pLocalData;
    CObjectAttributes oa;
    HANDLE hProcess;

    //
    // Create initial thread object
    //

    palError = CreateThreadObject(pThread, pThread, &hThread);
    if (NO_ERROR != palError)
    {
        goto CreateInitialProcessAndThreadObjectsExit;
    }

    //
    // This handle isn't needed
    //

    (void) g_pObjectManager->RevokeHandle(pThread, hThread);

    //
    // Create and initialize process object
    //

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otProcess,
        &oa,
        &pobjProcess
        );

    if (NO_ERROR != palError)
    {
        ERROR("Unable to allocate process object");
        goto CreateInitialProcessAndThreadObjectsExit;
    }

    palError = pobjProcess->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void **>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        ASSERT("Unable to access local data");
        goto CreateInitialProcessAndThreadObjectsExit;
    }

    pLocalData->dwProcessId = gPID;
    pLocalData->ps = PS_RUNNING;
    pDataLock->ReleaseLock(pThread, TRUE);

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pobjProcess,
        &aotProcess,
        PROCESS_ALL_ACCESS,
        &hProcess,
        &g_pobjProcess
        );

    //
    // pobjProcess is invalidated by the call to RegisterObject, so
    // NULL it out here to prevent it from being released later
    //

    pobjProcess = NULL;

    if (NO_ERROR != palError)
    {
        ASSERT("Failure registering process object");
        goto CreateInitialProcessAndThreadObjectsExit;
    }

    //
    // There's no need to keep this handle around, so revoke
    // it now
    //

    g_pObjectManager->RevokeHandle(pThread, hProcess);

CreateInitialProcessAndThreadObjectsExit:

    if (NULL != pobjProcess)
    {
        pobjProcess->ReleaseReference(pThread);
    }

    return palError;
}